

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_operationset.c
# Opt level: O0

void FAudio_OPERATIONSET_ClearAllForVoice(FAudioVoice *voice)

{
  FAudio_OPERATIONSET_Operation **in_stack_00000018;
  FAudioVoice *in_stack_00000020;
  
  FAudio_PlatformLockMutex((FAudioMutex)0x1356b5);
  RemoveFromList(in_stack_00000020,in_stack_00000018);
  RemoveFromList(in_stack_00000020,in_stack_00000018);
  FAudio_PlatformUnlockMutex((FAudioMutex)0x1356f0);
  return;
}

Assistant:

void FAudio_OPERATIONSET_ClearAllForVoice(FAudioVoice *voice)
{
	FAudio_PlatformLockMutex(voice->audio->operationLock);
	LOG_MUTEX_LOCK(voice->audio, voice->audio->operationLock)

	RemoveFromList(voice, &voice->audio->queuedOperations);
	RemoveFromList(voice, &voice->audio->committedOperations);

	FAudio_PlatformUnlockMutex(voice->audio->operationLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->audio->operationLock)
}